

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O0

AmsConnection * __thiscall AmsRouter::GetConnection(AmsRouter *this,AmsNetId *amsDest)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_48 [3];
  _Self local_30;
  iterator it;
  lock_guard<std::recursive_mutex> lock;
  AmsNetId *amsDest_local;
  AmsRouter *this_local;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&it,&this->mutex);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
       ::find(&this->mapping,amsDest);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<AmsNetId,_AmsConnection_*,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_AmsConnection_*>_>_>
       ::end(&this->mapping);
  bVar1 = std::operator!=(&local_30,local_48);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_AmsNetId,_AmsConnection_*>_>::operator->
                       (&local_30);
    this_local = (AmsRouter *)ppVar2->second;
  }
  else {
    this_local = (AmsRouter *)0x0;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&it);
  return (AmsConnection *)this_local;
}

Assistant:

AmsConnection* AmsRouter::GetConnection(const AmsNetId& amsDest)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    const auto it = mapping.find(amsDest);
    if (it != mapping.end()) {
        return it->second;
    }
    return nullptr;
}